

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunPrepareSsaExit(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  if ((value == (VmValue *)0x0) || (value->typeID != 4)) {
    value = (VmValue *)0x0;
  }
  if ((VmFunction *)value != (VmFunction *)0x0) {
    module->currentFunction = (VmFunction *)value;
    IsolatePhiNodes(module,(VmFunction *)value);
    VmFunction::UpdateLiveSets((VmFunction *)value,module);
    ColorPhiWebs((VmFunction *)value);
    DecoalesceMergedSets(ctx,(VmFunction *)value);
    SequentializeParallelCopies(ctx,module,(VmFunction *)value);
    VmFunction::UpdateLiveSets((VmFunction *)value,module);
    module->currentFunction = (VmFunction *)0x0;
  }
  return;
}

Assistant:

void RunPrepareSsaExit(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		// Remove interferences between phi instruction registers by introducing copies
		IsolatePhiNodes(module, function);

		function->UpdateLiveSets(module);

		// Mark each phi-copy instuction web with a color
		ColorPhiWebs(function);

		// Remove colors from registers that introduce interferences between registers
		DecoalesceMergedSets(ctx, function);

		SequentializeParallelCopies(ctx, module, function);

		function->UpdateLiveSets(module);

		module->currentFunction = NULL;
	}
}